

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void negotiate(Curl_easy *data)

{
  TELNET *pTVar1;
  TELNET *tn;
  int i;
  Curl_easy *data_local;
  
  pTVar1 = (data->req).p.telnet;
  for (tn._4_4_ = 0; tn._4_4_ < 0x28; tn._4_4_ = tn._4_4_ + 1) {
    if (tn._4_4_ != 1) {
      if (pTVar1->us_preferred[tn._4_4_] == 1) {
        set_local_option(data,tn._4_4_,1);
      }
      if (pTVar1->him_preferred[tn._4_4_] == 1) {
        set_remote_option(data,tn._4_4_,1);
      }
    }
  }
  return;
}

Assistant:

static void negotiate(struct Curl_easy *data)
{
  int i;
  struct TELNET *tn = data->req.p.telnet;

  for(i = 0; i < CURL_NTELOPTS; i++) {
    if(i == CURL_TELOPT_ECHO)
      continue;

    if(tn->us_preferred[i] == CURL_YES)
      set_local_option(data, i, CURL_YES);

    if(tn->him_preferred[i] == CURL_YES)
      set_remote_option(data, i, CURL_YES);
  }
}